

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

bool readLine(FILE *fp,string *str)

{
  size_t sVar1;
  int iVar2;
  __ssize_t _Var3;
  long lVar4;
  allocator local_51;
  string local_50 [32];
  size_t local_30;
  size_t n;
  char *line;
  string *str_local;
  FILE *fp_local;
  
  line = (char *)str;
  str_local = (string *)fp;
  iVar2 = feof((FILE *)fp);
  if ((iVar2 != 0) || (iVar2 = ferror((FILE *)str_local), iVar2 != 0)) {
    return false;
  }
  n = 0;
  local_30 = 0;
  _Var3 = getline((char **)&n,&local_30,(FILE *)str_local);
  sVar1 = n;
  if ((_Var3 != 0) && (local_30 != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,(char *)sVar1,&local_51);
    std::__cxx11::string::operator=((string *)line,local_50);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    free((void *)n);
    lVar4 = std::__cxx11::string::size();
    if ((lVar4 == 0) && (iVar2 = feof((FILE *)str_local), iVar2 != 0)) {
      return false;
    }
    return true;
  }
  return false;
}

Assistant:

bool readLine(FILE *fp, std::string &str) {
  if (feof(fp) || ferror(fp))
    return false;
  char *line = nullptr;
  size_t n = 0;
  if (!getline(&line, &n, fp) || n == 0)
    return false;
  str = std::string(line);
  free(line);
  if (str.size() == 0 && feof(fp))
    return false;
  else
    return true;
}